

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_tree.h
# Opt level: O2

size_t dicroce::blob_tree::_write_treeb(blob_tree *rt,uint8_t *p,uint8_t *end)

{
  uint8_t *__dest;
  pointer pbVar1;
  ushort uVar2;
  uint uVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  runtime_error *this;
  ulong uVar6;
  const_iterator __end4;
  const_iterator __begin4;
  pointer rt_00;
  ushort *puVar7;
  
  if ((ulong)((long)end - (long)p) < 5) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
    goto LAB_001064c9;
  }
  if ((rt->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if ((rt->_childrenByIndex).
        super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (rt->_childrenByIndex).
        super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      *p = '\x02';
      if ((ulong)((long)end - (long)(p + 1)) < 4) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
      }
      else {
        uVar6 = (rt->_payload).first;
        uVar3 = (uint)uVar6;
        uVar6 = uVar6 & 0xffffffff;
        *(uint *)(p + 1) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        __dest = p + 5;
        if (uVar6 <= (ulong)((long)end - (long)__dest)) {
          memcpy(__dest,(rt->_payload).second,uVar6);
          puVar7 = (ushort *)(__dest + uVar6);
          goto LAB_0010647e;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
      }
LAB_001064c9:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *p = '\x01';
    rt_00 = (rt->_childrenByIndex).
            super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
            super__Vector_impl_data._M_start;
    pbVar1 = (rt->_childrenByIndex).
             super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = (uint)(((long)pbVar1 - (long)rt_00) / 0x58);
    *(uint *)(p + 1) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    puVar7 = (ushort *)(p + 5);
    for (; rt_00 != pbVar1; rt_00 = rt_00 + 1) {
      sVar4 = _write_treeb(rt_00,(uint8_t *)puVar7,end);
      puVar7 = (ushort *)((long)puVar7 + sVar4);
    }
  }
  else {
    *p = '\0';
    uVar3 = (uint)(rt->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *(uint *)(p + 1) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    puVar7 = (ushort *)(p + 5);
    for (p_Var5 = (rt->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(rt->_children)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      if ((ulong)((long)end - (long)puVar7) < 2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
        goto LAB_001064c9;
      }
      uVar6 = (ulong)p_Var5[1]._M_parent & 0xffff;
      uVar2 = (ushort)p_Var5[1]._M_parent;
      *puVar7 = uVar2 << 8 | uVar2 >> 8;
      puVar7 = puVar7 + 1;
      if ((ulong)((long)end - (long)puVar7) < uVar6) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
        goto LAB_001064c9;
      }
      memcpy(puVar7,*(void **)(p_Var5 + 1),uVar6);
      sVar4 = _write_treeb((blob_tree *)(p_Var5 + 2),(uint8_t *)((long)puVar7 + uVar6),end);
      puVar7 = (ushort *)((uint8_t *)((long)puVar7 + uVar6) + sVar4);
    }
  }
LAB_0010647e:
  return (long)puVar7 - (long)p;
}

Assistant:

inline static size_t _bytes_left(const uint8_t* p, const uint8_t* end) { return end - p; }